

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_tools.cpp
# Opt level: O0

void __thiscall miniros::network::HttpFrame::resetParseState(HttpFrame *this)

{
  long in_RDI;
  
  std::
  vector<miniros::network::HttpFrame::Field,_std::allocator<miniros::network::HttpFrame::Field>_>::
  clear((vector<miniros::network::HttpFrame::Field,_std::allocator<miniros::network::HttpFrame::Field>_>
         *)0x4560ac);
  *(undefined8 *)(in_RDI + 0x20) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0x28) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0x30) = 0xffffffffffffffff;
  *(undefined4 *)(in_RDI + 0x50) = 0;
  *(undefined4 *)(in_RDI + 0x54) = 0;
  *(undefined4 *)(in_RDI + 0x58) = 0;
  *(undefined4 *)(in_RDI + 0x5c) = 0;
  *(undefined4 *)(in_RDI + 0x60) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x68) = 0xffffffffffffffff;
  *(undefined1 *)(in_RDI + 100) = 1;
  *(undefined4 *)(in_RDI + 0x70) = 0;
  return;
}

Assistant:

void HttpFrame::resetParseState()
{
  fields.clear();
  requestType = {};
  requestUrl = {};
  requestHttpVersion = {};

  m_currentPosition = 0;
  m_bodyPosition = 0;
  m_bodyEnd = 0;
  m_tokenStart = 0;

  m_contentLength = -1;

  m_fieldName = {};

  m_keepAlive = true;

  m_state = HttpFrame::ParseRequest;
}